

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

Position aiBegin(char (*board) [15],int me)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (board[1][0] == '\0') {
    uVar3 = 1;
  }
  else {
    uVar3 = 0;
    for (uVar4 = 0; uVar4 != 0xf; uVar4 = uVar4 + 1) {
      uVar2 = 0xffffffff00000000;
      lVar5 = 0;
      while (lVar5 != 0xf) {
        uVar2 = uVar2 + 0x100000000;
        pcVar1 = *board + lVar5;
        lVar5 = lVar5 + 1;
        if (*pcVar1 == '\0') {
          uVar3 = uVar4 & 0xffffffff;
          goto LAB_00101211;
        }
      }
      board = board + 1;
    }
  }
  uVar2 = 0;
LAB_00101211:
  return (Position)(uVar2 | uVar3);
}

Assistant:

struct Position aiBegin(const char board[BOARD_SIZE][BOARD_SIZE], int me) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    struct Position preferedPos = {0, 0};

    //for (i = 0; i < BOARD_SIZE; i++) {
    //    for (j = 0; j < BOARD_SIZE; j++) {
    //        if (EMPTY == board[i][j]) {
    //            preferedPos.x = i;
    //            preferedPos.y = j;
    //            return preferedPos;
    //        }
    //    }
    //}

    if (EMPTY == board[1][0]) {
      preferedPos.x = 1;
      preferedPos.y = 0;
    } else {
      for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
          if (EMPTY == board[i][j]) {
            preferedPos.x = i;
            preferedPos.y = j;
            return preferedPos;
          }
        }
      }
    }

    return preferedPos;
}